

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

UChar32 utf8IteratorNext(UCharIterator *iter)

{
  byte bVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  
  uVar4 = iter->reservedField;
  if (uVar4 != 0) {
    iter->reservedField = 0;
    uVar4 = uVar4 & 0x3ff | 0xdc00;
    if (iter->index < 0) {
      return uVar4;
    }
    iter->index = iter->index + 1;
    return uVar4;
  }
  lVar8 = (long)iter->start;
  uVar4 = iter->limit;
  if ((int)uVar4 <= iter->start) {
    return -1;
  }
  pvVar3 = iter->context;
  uVar9 = lVar8 + 1;
  iter->start = (uint)uVar9;
  bVar1 = *(byte *)((long)pvVar3 + lVar8);
  uVar5 = (uint)bVar1;
  if (-1 < (char)bVar1) goto LAB_00333af0;
  if ((uint)uVar9 == uVar4) {
LAB_00333ae9:
    uVar9 = (ulong)uVar4;
  }
  else if (bVar1 < 0xe0) {
    if (0xc1 < bVar1) {
      uVar6 = uVar5 & 0x1f;
LAB_00333ba6:
      uVar5 = *(byte *)((long)pvVar3 + (long)(int)uVar9) ^ 0x80;
      if ((byte)uVar5 < 0x40) {
        uVar5 = uVar6 << 6 | uVar5;
        uVar6 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar6;
        iter->start = uVar6;
        goto LAB_00333af0;
      }
    }
  }
  else if (bVar1 < 0xf0) {
    uVar5 = uVar5 & 0xf;
    if (((byte)" 000000000000\x1000"[uVar5] >> (*(byte *)((long)pvVar3 + uVar9) >> 5) & 1) != 0) {
      bVar10 = *(byte *)((long)pvVar3 + uVar9) & 0x3f;
LAB_00333b7f:
      uVar6 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar6;
      iter->start = uVar6;
      if (uVar6 != uVar4) {
        uVar6 = (uint)bVar10 | uVar5 << 6;
        goto LAB_00333ba6;
      }
      goto LAB_00333ae9;
    }
  }
  else if (bVar1 < 0xf5) {
    bVar1 = *(byte *)((long)pvVar3 + uVar9);
    if (((uint)(int)""[bVar1 >> 4] >> (uVar5 - 0xf0 & 0x1f) & 1) != 0) {
      uVar9 = lVar8 + 2;
      iter->start = (uint)uVar9;
      if ((uint)uVar9 == uVar4) goto LAB_00333ae9;
      bVar10 = *(char *)((long)pvVar3 + uVar9) + 0x80;
      if (bVar10 < 0x40) {
        uVar5 = bVar1 & 0x3f | (uVar5 - 0xf0) * 0x40;
        uVar9 = uVar9 & 0xffffffff;
        goto LAB_00333b7f;
      }
      uVar9 = uVar9 & 0xffffffff;
    }
  }
  uVar5 = 0xfffd;
LAB_00333af0:
  iVar2 = iter->index;
  if (iVar2 < 0) {
    if (((uint)uVar9 == uVar4) && (-1 < iter->length)) {
      iter->index = iter->length - (uint)(0xffff < (int)uVar5);
    }
  }
  else {
    iter->index = iVar2 + 1;
    if ((iter->length < 0) && ((uint)uVar9 == uVar4)) {
      iVar7 = iVar2 + 2;
      if ((int)uVar5 < 0x10000) {
        iVar7 = iVar2 + 1;
      }
      iter->length = iVar7;
    }
  }
  if ((int)uVar5 < 0x10000) {
    return uVar5;
  }
  iter->reservedField = uVar5;
  return (uVar5 >> 10) + 0xd7c0 & 0xffff;
}

Assistant:

static UChar32 U_CALLCONV
utf8IteratorNext(UCharIterator *iter) {
    int32_t index;

    if(iter->reservedField!=0) {
        UChar trail=U16_TRAIL(iter->reservedField);
        iter->reservedField=0;
        if((index=iter->index)>=0) {
            iter->index=index+1;
        }
        return trail;
    } else if(iter->start<iter->limit) {
        const uint8_t *s=(const uint8_t *)iter->context;
        UChar32 c;

        U8_NEXT_OR_FFFD(s, iter->start, iter->limit, c);
        if((index=iter->index)>=0) {
            iter->index=++index;
            if(iter->length<0 && iter->start==iter->limit) {
                iter->length= c<=0xffff ? index : index+1;
            }
        } else if(iter->start==iter->limit && iter->length>=0) {
            iter->index= c<=0xffff ? iter->length : iter->length-1;
        }
        if(c<=0xffff) {
            return c;
        } else {
            iter->reservedField=c;
            return U16_LEAD(c);
        }
    } else {
        return U_SENTINEL;
    }
}